

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mat * rf_mat_look_at(rf_mat *__return_storage_ptr__,rf_vec3 eye,rf_vec3 target,rf_vec3 up)

{
  rf_mat mat;
  rf_vec3 rVar1;
  rf_vec3 rVar2;
  rf_vec3 rVar3;
  rf_mat *__src;
  rf_mat *result;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [64];
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_194;
  float local_18c;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  rf_vec3 y;
  float local_e8;
  float fStack_e4;
  rf_vec3 x;
  float local_78;
  float fStack_74;
  rf_vec3 z;
  rf_vec3 up_local;
  rf_vec3 target_local;
  float local_18;
  float fStack_14;
  rf_vec3 eye_local;
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __src = __return_storage_ptr__;
  rVar1 = rf_vec3_sub(eye,target);
  rVar1 = rf_vec3_normalize(rVar1);
  rVar2 = rf_vec3_cross_product(up,rVar1);
  rVar2 = rf_vec3_normalize(rVar2);
  local_178 = rVar2._0_8_;
  local_170 = rVar2.z;
  local_168 = rVar1._0_8_;
  local_160 = rVar1.z;
  unique0x10000808 = local_178;
  rVar3 = rf_vec3_cross_product(rVar1,rVar2);
  local_1a0 = rVar3.z;
  local_1a8 = rVar3._0_8_;
  local_188 = local_1a8;
  local_180 = local_1a0;
  local_158 = local_1a8;
  y.x = local_1a0;
  rVar3 = rf_vec3_normalize(rVar3);
  local_1b0 = rVar3.z;
  local_1b8 = rVar3._0_8_;
  local_e8 = rVar2.x;
  __src->m0 = local_e8;
  fStack_e4 = rVar2.y;
  __src->m1 = fStack_e4;
  __src->m2 = rVar2.z;
  __src->m3 = 0.0;
  local_158._0_4_ = rVar3.x;
  __src->m4 = (float)local_158;
  local_158._4_4_ = rVar3.y;
  __src->m5 = local_158._4_4_;
  __src->m6 = local_1b0;
  __src->m7 = 0.0;
  local_78 = rVar1.x;
  __src->m8 = local_78;
  fStack_74 = rVar1.y;
  __src->m9 = fStack_74;
  __src->m10 = rVar1.z;
  __src->m11 = 0.0;
  local_18 = eye.x;
  __src->m12 = local_18;
  fStack_14 = eye.y;
  __src->m13 = fStack_14;
  __src->m14 = eye.z;
  __src->m15 = 1.0;
  local_194 = local_1b8;
  local_18c = local_1b0;
  local_158 = local_1b8;
  y.x = local_1b0;
  memcpy(local_238,__src,0x40);
  mat.m8 = (float)(undefined4)local_228;
  mat.m12 = (float)local_228._4_4_;
  mat.m0 = (float)(undefined4)uStack_230;
  mat.m4 = (float)uStack_230._4_4_;
  mat.m1 = (float)(undefined4)uStack_220;
  mat.m5 = (float)uStack_220._4_4_;
  mat.m9 = (float)(undefined4)local_218;
  mat.m13 = (float)local_218._4_4_;
  mat.m2 = (float)(undefined4)uStack_210;
  mat.m6 = (float)uStack_210._4_4_;
  mat.m10 = (float)(undefined4)local_208;
  mat.m14 = (float)local_208._4_4_;
  mat.m3 = (float)(undefined4)uStack_200;
  mat.m7 = (float)uStack_200._4_4_;
  mat._56_8_ = __src;
  rf_mat_invert(mat);
  memcpy(__src,local_1f8,0x40);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_look_at(rf_vec3 eye, rf_vec3 target, rf_vec3 up)
{
    rf_mat result = {0};

    rf_vec3 z = rf_vec3_sub(eye, target);
    z = rf_vec3_normalize(z);
    rf_vec3 x = rf_vec3_cross_product(up, z);
    x = rf_vec3_normalize(x);
    rf_vec3 y = rf_vec3_cross_product(z, x);
    y = rf_vec3_normalize(y);

    result.m0 = x.x;
    result.m1 = x.y;
    result.m2 = x.z;
    result.m3 = 0.0f;
    result.m4 = y.x;
    result.m5 = y.y;
    result.m6 = y.z;
    result.m7 = 0.0f;
    result.m8 = z.x;
    result.m9 = z.y;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = eye.x;
    result.m13 = eye.y;
    result.m14 = eye.z;
    result.m15 = 1.0f;

    result = rf_mat_invert(result);

    return result;
}